

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_unix.c
# Opt level: O2

int w_format_system_error(char *msg,size_t msg_len,int error)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  
  if (msg != (char *)0x0) {
    puVar3 = (uint *)__errno_location();
    *puVar3 = 0;
    iVar1 = __xpg_strerror_r(error,msg,msg_len);
    if (iVar1 == 0) {
      uVar2 = 0;
    }
    else {
      uVar2 = -(uint)(*puVar3 == 0) | *puVar3;
    }
    return uVar2;
  }
  _exit(-1);
}

Assistant:

int
w_format_system_error(
    char *msg,
    size_t msg_len,
    int error
)
{
    WP_PLATFORM_ASSERT(msg != NULL);

#if (                                                                          \
        (                                                                      \
               (defined(_POSIX_C_SOURCE) && _POSIX_C_SOURCE >= 200112L)        \
            || (defined(_XOPEN_SOURCE) && _XOPEN_SOURCE >= 600)                \
        )                                                                      \
        && !defined(_GNU_SOURCE)                                               \
    )
    // XSI-compliant implementation of ‘strerror_r()’.
    errno = 0;
    if (strerror_r(error, msg, msg_len) != 0)
    {
        return wp_platform_enforce_error(errno);
    }
#else
    {
        char *err;

        // GNU-specific implementation of ‘strerror_r()’.
        errno = 0;
        err = strerror_r(error, msg, msg_len);
        if (err == NULL)
        {
            return wp_platform_enforce_error(errno);
        }

        // The GNU implementation may or may not use the buffer that we passed
        // so we may need to copy the message returned over to our buffer.
        if (err != msg)
        {
            strncpy(msg, err, msg_len);
        }
    }
#endif

    return 0;
}